

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

shared_ptr<libtorrent::aux::torrent> __thiscall
libtorrent::aux::session_impl::delay_load_torrent
          (session_impl *this,info_hash_t *info_hash,peer_connection *pc)

{
  bool bVar1;
  uint uVar2;
  reference this_00;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<libtorrent::aux::torrent> sVar5;
  undefined1 local_3f8 [8];
  torrent_handle handle;
  error_code ec;
  undefined1 local_3c8 [48];
  undefined1 local_398 [8];
  add_torrent_params p;
  shared_ptr<libtorrent::plugin> *e;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  peer_connection *pc_local;
  info_hash_t *info_hash_local;
  session_impl *this_local;
  
  this_00 = ::std::
            array<std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>,_5UL>
            ::operator[]((array<std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>,_5UL>
                          *)(info_hash[0xa0].v2.m_number._M_elems + 7),0);
  __end2 = ::std::
           vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
           ::begin(this_00);
  e = (shared_ptr<libtorrent::plugin> *)
      ::std::
      vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
      ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
                                     *)&e), bVar1) {
    p.creation_date =
         (time_t)__gnu_cxx::
                 __normal_iterator<std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
                 ::operator*(&__end2);
    add_torrent_params::add_torrent_params((add_torrent_params *)local_398);
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)p.creation_date);
    peer_connection::self((peer_connection *)local_3c8);
    ::std::weak_ptr<libtorrent::aux::peer_connection>::
    weak_ptr<libtorrent::aux::peer_connection,void>
              ((weak_ptr<libtorrent::aux::peer_connection> *)(local_3c8 + 0x10),
               (shared_ptr<libtorrent::aux::peer_connection> *)local_3c8);
    peer_connection_handle::peer_connection_handle
              ((peer_connection_handle *)(local_3c8 + 0x20),
               (weak_ptr<libtorrent::aux::peer_connection> *)(local_3c8 + 0x10));
    uVar2 = (*peVar3->_vptr_plugin[8])(peVar3,pc,local_3c8 + 0x20,local_398);
    peer_connection_handle::~peer_connection_handle((peer_connection_handle *)(local_3c8 + 0x20));
    ::std::weak_ptr<libtorrent::aux::peer_connection>::~weak_ptr
              ((weak_ptr<libtorrent::aux::peer_connection> *)(local_3c8 + 0x10));
    ::std::shared_ptr<libtorrent::aux::peer_connection>::~shared_ptr
              ((shared_ptr<libtorrent::aux::peer_connection> *)local_3c8);
    bVar1 = (uVar2 & 1) != 0;
    if (bVar1) {
      boost::system::error_code::error_code
                ((error_code *)
                 &handle.m_torrent.
                  super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      add_torrent((session_impl *)local_3f8,(add_torrent_params *)info_hash,(error_code *)local_398)
      ;
      torrent_handle::native_handle((torrent_handle *)this);
      torrent_handle::~torrent_handle((torrent_handle *)local_3f8);
    }
    add_torrent_params::~add_torrent_params((add_torrent_params *)local_398);
    _Var4._M_pi = extraout_RDX;
    if (bVar1) goto LAB_00597e57;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
    ::operator++(&__end2);
  }
  ::std::shared_ptr<libtorrent::aux::torrent>::shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)this);
  _Var4._M_pi = extraout_RDX_00;
LAB_00597e57:
  sVar5.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<libtorrent::aux::torrent>)
         sVar5.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<torrent> session_impl::delay_load_torrent(info_hash_t const& info_hash
		, peer_connection* pc)
	{
#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& e : m_ses_extensions[plugins_all_idx])
		{
			add_torrent_params p;
			if (e->on_unknown_torrent(info_hash, peer_connection_handle(pc->self()), p))
			{
				error_code ec;
				torrent_handle handle = add_torrent(std::move(p), ec);

				return handle.native_handle();
			}
		}
#else
		TORRENT_UNUSED(pc);
		TORRENT_UNUSED(info_hash);
#endif
		return std::shared_ptr<torrent>();
	}